

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aialgorithm.h
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
ai::
extractKeys<std::map<unsigned_long,std::__cxx11::string,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,ai *this,
          map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *map)

{
  iterator __position;
  _Rb_tree_node_base *p_Var1;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (__return_storage_ptr__,*(size_type *)(this + 0x28));
  for (p_Var1 = *(_Rb_tree_node_base **)(this + 0x18); p_Var1 != (_Rb_tree_node_base *)(this + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                 __position,(unsigned_long *)(p_Var1 + 1));
    }
    else {
      *__position._M_current = *(unsigned_long *)(p_Var1 + 1);
      (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename Map::key_type> extractKeys(const Map& map)
    {
        static_assert(std::is_same<typename Map::mapped_type, typename Map::value_type::second_type>::value,
            "map must provide AssociativeContainer requirements. see: https://en.cppreference.com/w/cpp/named_req/AssociativeContainer");

        std::vector<typename Map::key_type> result;
        result.reserve(map.size());
        for(const auto& it : map)
        {
            result.push_back(it.first);
        }
        return result;
    }